

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcPropertyBoundedValue::~IfcPropertyBoundedValue
          (IfcPropertyBoundedValue *this)

{
  ~IfcPropertyBoundedValue
            ((IfcPropertyBoundedValue *)
             &this[-1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPropertyBoundedValue,_3UL>.
              aux_is_derived);
  return;
}

Assistant:

IfcPropertyBoundedValue() : Object("IfcPropertyBoundedValue") {}